

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounds.c
# Opt level: O2

int dotalk(void)

{
  byte *pbVar1;
  permonst *ppVar2;
  ulong uVar3;
  level *lev;
  boolean bVar4;
  boolean bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong in_RAX;
  obj *poVar9;
  char cVar10;
  ulong in_RDX;
  ulong extraout_RDX;
  int iVar11;
  char *pcVar12;
  monst *pmVar13;
  char *line;
  long lVar14;
  int iVar15;
  boolean local_38;
  schar dy;
  schar dx;
  undefined7 local_37;
  
  bVar4 = flags.soundok;
  flags.soundok = '\x01';
  _local_38 = in_RAX;
  if ((youmonst.data)->msound == '\0') {
    pcVar12 = mons_mname(youmonst.data);
    pcVar12 = an(pcVar12);
    line = "As %s, you cannot speak.";
LAB_00236cc1:
    pline(line,pcVar12);
  }
  else {
    if (u.uprops[0x22].intrinsic == 0) {
      if ((u._1052_1_ & 1) == 0) {
        if ((u._1052_1_ & 2) == 0) {
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00236cf2;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00236ced;
LAB_00236d3b:
            poVar9 = shop_object(u.ux,u.uy);
            in_RDX = extraout_RDX;
            if (poVar9 != (obj *)0x0) {
              price_quote(poVar9);
              flags.soundok = bVar4;
              return 1;
            }
          }
          else {
LAB_00236ced:
            if (ublindf != (obj *)0x0) {
LAB_00236cf2:
              if (ublindf->oartifact == '\x1d') goto LAB_00236d3b;
            }
          }
          _local_38 = CONCAT71(local_37,bVar4);
          iVar15 = 0;
          for (iVar11 = -1; iVar11 != 2; iVar11 = iVar11 + 1) {
            for (lVar14 = -1; (int)lVar14 != 2; lVar14 = lVar14 + 1) {
              if ((int)lVar14 == 0 && iVar11 == 0) {
                if (u.usteed != (monst *)0x0) {
                  iVar15 = iVar15 + 1;
                  uVar3 = _local_38 >> 0x10;
                  _local_38 = CONCAT11(1,(char)_local_38);
                  _local_38 = CONCAT62((int6)uVar3,_local_38) & 0xffffffff0000ffff;
                  in_RDX = CONCAT71((int7)(in_RDX >> 8),1);
                }
              }
              else {
                pmVar13 = level->monsters[(long)u.ux + (long)iVar11][u.uy + lVar14];
                if ((pmVar13 != (monst *)0x0) &&
                   (uVar7 = *(uint *)&pmVar13->field_0x60, (uVar7 >> 9 & 1) == 0)) {
                  _local_38 = CONCAT44((int)in_RDX,_local_38);
                  if (pmVar13->wormno == '\0') {
                    if ((viz_array[pmVar13->my][pmVar13->mx] & 2U) != 0) goto LAB_00236ebe;
                    if (u.uprops[0x1e].intrinsic == 0) {
                      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00236e5f;
                      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00236e56;
                    }
                    else {
LAB_00236e56:
                      if (ublindf == (obj *)0x0) goto LAB_00236f09;
LAB_00236e5f:
                      if (ublindf->oartifact != '\x1d') goto LAB_00236f09;
                    }
                    if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                         (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                        ((viz_array[pmVar13->my][pmVar13->mx] & 1U) != 0)) &&
                       ((pmVar13->data->mflags3 & 0x200) != 0)) goto LAB_00236ebe;
LAB_00236f09:
                    if (((pmVar13->data->mflags1 & 0x10000) == 0) &&
                       ((poVar9 = which_armor(pmVar13,4), poVar9 == (obj *)0x0 ||
                        (poVar9 = which_armor(pmVar13,4), poVar9->otyp != 0x4f)))) {
                      if (u.uprops[0x1e].intrinsic == 0) {
                        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00236f64;
                        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00236f5f;
                      }
                      else {
LAB_00236f5f:
                        if (ublindf != (obj *)0x0) {
LAB_00236f64:
                          if (ublindf->oartifact == '\x1d') goto LAB_00236ff6;
                        }
                        if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                             (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                             youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0))
                        goto LAB_00237055;
                      }
LAB_00236ff6:
                      if ((u.uprops[0x19].extrinsic != 0) &&
                         ((u.uprops[0x19].blocked == 0 &&
                          (iVar6 = dist2((int)pmVar13->mx,(int)pmVar13->my,(int)u.ux,(int)u.uy),
                          iVar6 < 0x41)))) goto LAB_00237055;
                    }
                    if ((u.uprops[0x42].intrinsic == 0) &&
                       ((u.uprops[0x42].extrinsic == 0 &&
                        (bVar4 = match_warn_of_mon(pmVar13), bVar4 == '\0')))) {
                      in_RDX = _local_38 >> 0x20;
                      goto LAB_00237068;
                    }
                  }
                  else {
                    bVar4 = worm_known(level,pmVar13);
                    if (bVar4 == '\0') goto LAB_00236f09;
                    uVar7 = *(uint *)&pmVar13->field_0x60;
LAB_00236ebe:
                    if ((((uVar7 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
                       (u.uprops[0xc].extrinsic == 0)) {
                      if (((uVar7 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
                      goto LAB_00236efb;
                      goto LAB_00236f09;
                    }
                    if ((uVar7 & 0x280) != 0) goto LAB_00236f09;
LAB_00236efb:
                    if ((u._1052_1_ & 0x20) != 0) goto LAB_00236f09;
                  }
LAB_00237055:
                  iVar15 = iVar15 + 1;
                  _local_38 = CONCAT53(CONCAT41(local_37._3_4_,(char)iVar11),
                                       CONCAT12((char)lVar14,_local_38));
                  _local_38 = CONCAT62(_dy,_local_38) & 0xffffffffffff00ff;
                  in_RDX = 0;
                }
              }
LAB_00237068:
            }
          }
          bVar4 = local_38;
          if ((iVar15 != 1) || (iflags.paranoid_chat != '\0')) {
            iVar11 = getdir("Talk to whom? (in what direction)",&dx,&dy,
                            (schar *)&stack0xffffffffffffffc9);
            if (iVar11 == 0) {
              flags.soundok = bVar4;
              return 0;
            }
            in_RDX = _local_38 >> 8 & 0xff;
          }
          lev = level;
          cVar10 = (char)in_RDX;
          if (cVar10 < '\x01' || u.usteed == (monst *)0x0) {
            if (cVar10 != '\0') {
              pcVar12 = "down";
              if (cVar10 < '\0') {
                pcVar12 = "up";
              }
              line = "They won\'t hear you %s there.";
              goto LAB_00236cc1;
            }
            if (dx == '\0' && dy == '\0') {
              pcVar12 = "Talking to yourself is a bad habit for a dungeoneer.";
              goto LAB_00236d0a;
            }
            pmVar13 = level->monsters[(long)u.ux + (long)dx][(long)u.uy + (long)dy];
            if (pmVar13 == (monst *)0x0) {
              flags.soundok = bVar4;
              return 0;
            }
            uVar7 = *(uint *)&pmVar13->field_0x60;
            if ((uVar7 & 0x280) != 0) {
              flags.soundok = bVar4;
              return 0;
            }
            if ((byte)(pmVar13->m_ap_type - 1) < 2) {
              flags.soundok = bVar4;
              return 0;
            }
            if (((byte)(uVar7 >> 0x1c) & 1) != 0 || (uVar7 & 0xc0000) == 0x40000) {
              pbVar1 = (byte *)((long)&pmVar13->mstrategy + 3);
              *pbVar1 = *pbVar1 & 0xcf;
              if ((pmVar13->mtame == '\0') || (pmVar13->meating == 0)) {
                if (urole.malenum != 0x15d) {
LAB_002370ed:
                  iVar11 = domonnoise(pmVar13);
                  flags.soundok = bVar4;
                  return iVar11;
                }
                ppVar2 = pmVar13->data;
                if (((pmVar13->mtame != '\0') || ((uVar7 & 0x400000) != 0)) ||
                   (((ppVar2 != mons + 0x5c && ppVar2 != mons + 0x5e) &&
                    (ppVar2 != mons + 0x5a && ppVar2 != mons + 0x5b)) && ppVar2 != mons + 0x5f))
                goto LAB_002370ed;
                uVar7 = mt_random();
                uVar7 = uVar7 % 10;
                if (((int)u.moreluck + (int)u.uluck != 0) &&
                   (iVar11 = rn2(0x32 - ((int)u.moreluck + (int)u.uluck)), iVar11 != 0)) {
                  uVar8 = (int)u.moreluck + (int)u.uluck;
                  if (-6 < (int)uVar8) {
                    uVar8 = (uint)(short)((int)((uint)(ushort)((short)uVar8 >> 0xf) << 0x10 |
                                               uVar8 & 0xffff) / 3);
                  }
                  uVar7 = uVar7 - uVar8;
                  if ((int)uVar7 < 0) {
                    uVar7 = 0;
                  }
                  else if (8 < uVar7) {
                    uVar7 = 9;
                  }
                }
                l_monnam(pmVar13);
                pline("You attempt to soothe the %s with chittering sounds.");
                if (uVar7 < 2) {
                  tamedog(pmVar13,(obj *)0x0);
                }
                else if (uVar7 < 9) {
                  pmVar13->field_0x62 = pmVar13->field_0x62 | 0x40;
                  set_malign(pmVar13);
                }
                else {
                  pcVar12 = Monnam(pmVar13);
                  pline("%s unfortunately ignores your overtures.",pcVar12);
                }
                iVar11 = 1;
                goto LAB_0023783f;
              }
              if (pmVar13->wormno == '\0') {
                if ((viz_array[pmVar13->my][pmVar13->mx] & 2U) != 0) goto LAB_00237627;
                if (u.uprops[0x1e].intrinsic == 0) {
                  if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002373c5;
                  if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002373bc;
                }
                else {
LAB_002373bc:
                  if (ublindf == (obj *)0x0) goto LAB_0023766d;
LAB_002373c5:
                  if (ublindf->oartifact != '\x1d') goto LAB_0023766d;
                }
                if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                     (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                    ((viz_array[pmVar13->my][pmVar13->mx] & 1U) != 0)) &&
                   ((pmVar13->data->mflags3 & 0x200) != 0)) goto LAB_00237627;
LAB_0023766d:
                if (((pmVar13->data->mflags1 & 0x10000) == 0) &&
                   ((poVar9 = which_armor(pmVar13,4), poVar9 == (obj *)0x0 ||
                    (poVar9 = which_armor(pmVar13,4), poVar9->otyp != 0x4f)))) {
                  if (u.uprops[0x1e].intrinsic == 0) {
                    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002376c1;
                    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002376bc;
                  }
                  else {
LAB_002376bc:
                    if (ublindf != (obj *)0x0) {
LAB_002376c1:
                      if (ublindf->oartifact == '\x1d') goto LAB_00237754;
                    }
                    if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                         (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                         youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0))
                    goto LAB_002377c7;
                  }
LAB_00237754:
                  if ((u.uprops[0x19].extrinsic != 0) &&
                     ((u.uprops[0x19].blocked == 0 &&
                      (iVar11 = dist2((int)pmVar13->mx,(int)pmVar13->my,(int)u.ux,(int)u.uy),
                      iVar11 < 0x41)))) goto LAB_002377c7;
                }
                if ((u.uprops[0x42].intrinsic == 0) &&
                   ((u.uprops[0x42].extrinsic == 0 &&
                    (bVar4 = match_warn_of_mon(pmVar13), bVar4 == '\0')))) {
                  map_invisible(pmVar13->mx,pmVar13->my);
                }
              }
              else {
                bVar4 = worm_known(lev,pmVar13);
                if (bVar4 == '\0') goto LAB_0023766d;
                uVar7 = *(uint *)&pmVar13->field_0x60;
LAB_00237627:
                if ((((uVar7 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
                   (u.uprops[0xc].extrinsic == 0)) {
                  if (((uVar7 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
                  goto LAB_00237660;
                  goto LAB_0023766d;
                }
                if ((uVar7 & 0x280) != 0) goto LAB_0023766d;
LAB_00237660:
                if ((u._1052_1_ & 0x20) != 0) goto LAB_0023766d;
              }
LAB_002377c7:
              pcVar12 = Monnam(pmVar13);
              iVar11 = 0;
              pline("%s is eating noisily.",pcVar12);
LAB_0023783f:
              flags.soundok = local_38;
              return iVar11;
            }
            if (pmVar13->wormno == '\0') {
              if ((viz_array[pmVar13->my][pmVar13->mx] & 2U) != 0) goto LAB_0023742c;
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0023736b;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00237362;
              }
              else {
LAB_00237362:
                if (ublindf == (obj *)0x0) goto LAB_00237475;
LAB_0023736b:
                if (ublindf->oartifact != '\x1d') goto LAB_00237475;
              }
              if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                   (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                  ((viz_array[pmVar13->my][pmVar13->mx] & 1U) != 0)) &&
                 ((pmVar13->data->mflags3 & 0x200) != 0)) goto LAB_0023742c;
LAB_00237475:
              if (((pmVar13->data->mflags1 & 0x10000) == 0) &&
                 ((poVar9 = which_armor(pmVar13,4), poVar9 == (obj *)0x0 ||
                  (poVar9 = which_armor(pmVar13,4), poVar9->otyp != 0x4f)))) {
                if (u.uprops[0x1e].intrinsic == 0) {
                  if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002374d0;
                  if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002374cb;
                }
                else {
LAB_002374cb:
                  if (ublindf != (obj *)0x0) {
LAB_002374d0:
                    if (ublindf->oartifact == '\x1d') goto LAB_0023755f;
                  }
                  if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                       (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                       youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0))
                  goto LAB_002375b9;
                }
LAB_0023755f:
                if ((u.uprops[0x19].extrinsic != 0) &&
                   ((u.uprops[0x19].blocked == 0 &&
                    (iVar11 = dist2((int)pmVar13->mx,(int)pmVar13->my,(int)u.ux,(int)u.uy),
                    iVar11 < 0x41)))) goto LAB_002375b9;
              }
              if ((u.uprops[0x42].intrinsic == 0) &&
                 ((u.uprops[0x42].extrinsic == 0 &&
                  (bVar5 = match_warn_of_mon(pmVar13), bVar5 == '\0')))) {
                flags.soundok = bVar4;
                return 0;
              }
            }
            else {
              bVar5 = worm_known(level,pmVar13);
              if (bVar5 == '\0') goto LAB_00237475;
              uVar7 = *(uint *)&pmVar13->field_0x60;
LAB_0023742c:
              if ((((uVar7 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
                 (u.uprops[0xc].extrinsic == 0)) {
                if (((uVar7 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
                goto LAB_00237467;
                goto LAB_00237475;
              }
              if ((uVar7 & 0x280) != 0) goto LAB_00237475;
LAB_00237467:
              if ((u._1052_1_ & 0x20) != 0) goto LAB_00237475;
            }
LAB_002375b9:
            pcVar12 = Monnam(pmVar13);
            line = "%s seems not to notice you.";
            goto LAB_00236cc1;
          }
          pmVar13 = u.usteed;
          if ((*(uint *)&(u.usteed)->field_0x60 & 0xc0000) == 0x40000) goto LAB_002370ed;
          pcVar12 = "Your steed remains silent...";
        }
        else {
          pcVar12 = "Your speech is unintelligible underwater.";
        }
      }
      else {
        pcVar12 = "They won\'t hear you out there.";
      }
    }
    else {
      pcVar12 = "You can\'t speak.  You\'re choking!";
    }
LAB_00236d0a:
    pline(pcVar12);
  }
  flags.soundok = bVar4;
  return 0;
}

Assistant:

int dotalk(void)
{
    int result;
    boolean save_soundok = flags.soundok;
    flags.soundok = 1;	/* always allow sounds while chatting */
    result = dochat();
    flags.soundok = save_soundok;
    return result;
}